

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

void __thiscall kj::ExceptionImpl::~ExceptionImpl(ExceptionImpl *this)

{
  long *in_FS_OFFSET;
  Fault local_20;
  Fault f;
  ExceptionImpl **ptr;
  ExceptionImpl *this_local;
  
  *(undefined ***)this = &PTR__ExceptionImpl_00da0f48;
  anon_unknown_70::validateExceptionPointer(this->nextCurrentException);
  f.exception = (Exception *)(*in_FS_OFFSET + -0x10);
  while( true ) {
    if (((f.exception)->ownFile).content.ptr == (char *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[50]>
                (&local_20,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
                 ,0x48a,FAILED,(char *)0x0,"\"ExceptionImpl not found on currentException list?\"",
                 (char (*) [50])"ExceptionImpl not found on currentException list?");
      kj::_::Debug::Fault::fatal(&local_20);
    }
    if ((ExceptionImpl *)((f.exception)->ownFile).content.ptr == this) break;
    f.exception = (Exception *)(((f.exception)->ownFile).content.ptr + 0x1b0);
  }
  ((f.exception)->ownFile).content.ptr = (char *)this->nextCurrentException;
  String::~String(&this->whatBuffer);
  std::exception::~exception(&this->super_exception);
  Exception::~Exception(&this->super_Exception);
  return;
}

Assistant:

~ExceptionImpl() noexcept {
    // Look for ourselves in the list.
    validateExceptionPointer(nextCurrentException);
    for (auto* ptr = &currentException; *ptr != nullptr; ptr = &(*ptr)->nextCurrentException) {
      if (*ptr == this) {
        *ptr = nextCurrentException;
        return;
      }
    }

    // Possibly the ExceptionImpl was destroyed on a different thread than created it? That's
    // pretty bad, we'd better abort.
    KJ_FAIL_ASSERT("ExceptionImpl not found on currentException list?");
  }